

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase<int> *this,Context *context,char *varName,
          GetConstantValueFunc getValue,char *requiredExt)

{
  size_t sVar1;
  bool *__s;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,varName,&local_69);
  makeCaseName(&local_68,&local_48);
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,local_68._M_dataplus._M_p,varName);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02198670;
  (this->super_TestCase).m_context = context;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_021ac8d8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_varName,varName,(allocator<char> *)&local_68);
  this->m_getValue = getValue;
  __s = glcts::fixed_sample_locations_values + 1;
  if (requiredExt != (char *)0x0) {
    __s = (bool *)requiredExt;
  }
  (this->m_requiredExt)._M_dataplus._M_p = (pointer)&(this->m_requiredExt).field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_requiredExt,__s,__s + sVar1);
  return;
}

Assistant:

ShaderBuiltinConstantCase<DataType>::ShaderBuiltinConstantCase (Context& context, const char* varName, GetConstantValueFunc getValue, const char* requiredExt)
	: TestCase		(context, makeCaseName(varName).c_str(), varName)
	, m_varName		(varName)
	, m_getValue	(getValue)
	, m_requiredExt	(requiredExt ? requiredExt : "")
{
	DE_ASSERT(!requiredExt == m_requiredExt.empty());
}